

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::write_codepoint<8ul,char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char prefix,uint32_t cp)

{
  basic_appender<char> bVar1;
  undefined1 in_SIL;
  buffer<char> *in_RDI;
  char buf [8];
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint value;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  basic_appender<char> local_28;
  basic_appender<char> local_20;
  undefined1 local_11;
  basic_appender<char> local_10 [2];
  
  local_11 = in_SIL;
  local_10[0].container = in_RDI;
  local_20 = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*(&local_20);
  basic_appender<char>::operator=
            ((basic_appender<char> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbf);
  value = CONCAT13(local_11,(int3)in_stack_ffffffffffffffc4);
  local_28 = basic_appender<char>::operator++(local_10,0);
  basic_appender<char>::operator*(&local_28);
  basic_appender<char>::operator=
            ((basic_appender<char> *)CONCAT44(value,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffbf);
  fill_n<char,unsigned_long>
            ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (unsigned_long)in_stack_ffffffffffffffc8,(char)(value >> 0x18));
  format_base2e<char,unsigned_int>
            (in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,value,in_stack_ffffffffffffffc0,
             (bool)in_stack_ffffffffffffffbf);
  bVar1 = copy<char,_char_*,_fmt::v11::basic_appender<char>,_0>
                    ((char *)CONCAT44(value,in_stack_ffffffffffffffc0),
                     (char *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                     local_10[0]);
  return (basic_appender<char>)bVar1.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_base2e(4, buf, cp, width);
  return copy<Char>(buf, buf + width, out);
}